

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

char server::textcmd(char *a,char *text)

{
  int iVar1;
  size_t sVar2;
  int local_28;
  int local_24;
  int l;
  int b;
  char *text_local;
  char *a_local;
  
  for (local_24 = 0; sVar2 = strlen(a), (ulong)(long)local_24 < sVar2; local_24 = local_24 + 1) {
    if (text[local_24 + 1] != a[local_24]) {
      return '\0';
    }
  }
  sVar2 = strlen(a);
  if ((text[sVar2 + 1] != ' ') && (sVar2 = strlen(a), text[sVar2 + 1] != '\0')) {
    local_28 = 0;
    while( true ) {
      if (2 < local_28) {
        return '\0';
      }
      iVar1 = strcmp(blkmsg + (long)local_28 * 0x104,a);
      if (iVar1 != 0) break;
      local_28 = local_28 + 1;
    }
    return '\x01';
  }
  return '\x01';
}

Assistant:

char textcmd(const char *a, const char *text){
        for (int b=0; b<strlen(a); b++) {
            if (text[b+1] != a[b]) {
                return false;
            }
        }
        if(text[strlen(a)+1] != ' ' && text[strlen(a)+1] != '\0') {
            for (int l=0; l<3; l++) {
                if (strcmp(blkmsg[l], a)) {
                    return true;
                    break;
                }
            }
            return false;
        }
        return true;
    }